

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpscheduler.cpp
# Opt level: O1

RTPTime __thiscall jrtplib::RTCPScheduler::GetTransmissionDelay(RTCPScheduler *this)

{
  double dVar1;
  double dVar2;
  timespec tpMono;
  timespec tpMono_1;
  timespec local_38;
  timespec local_28;
  
  if (this->firstcall == true) {
    this->firstcall = false;
    if (RTPTime::CurrentTime()::s_initialized == '\0') {
      RTPTime::CurrentTime()::s_initialized = '\x01';
      clock_gettime(0,&local_38);
      clock_gettime(1,&local_28);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec;
      RTPTime::CurrentTime()::s_startOffet =
           dVar2 - ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
    }
    else {
      clock_gettime(1,&local_38);
      dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec +
              RTPTime::CurrentTime()::s_startOffet;
    }
    (this->prevrtcptime).m_t = dVar2;
    this->pmembers = this->sources->activecount;
    CalculateNextRTCPTime(this);
  }
  if (RTPTime::CurrentTime()::s_initialized == '\0') {
    RTPTime::CurrentTime()::s_initialized = '\x01';
    clock_gettime(0,&local_38);
    clock_gettime(1,&local_28);
    dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec;
    RTPTime::CurrentTime()::s_startOffet =
         dVar2 - ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec);
  }
  else {
    clock_gettime(1,&local_38);
    dVar2 = (double)local_38.tv_nsec * 1e-09 + (double)local_38.tv_sec +
            RTPTime::CurrentTime()::s_startOffet;
  }
  dVar1 = (this->nextrtcptime).m_t;
  return (RTPTime)(~-(ulong)(dVar1 < dVar2) & dVar1 - dVar2);
}

Assistant:

RTPTime RTCPScheduler::GetTransmissionDelay()
{
	if (firstcall)
	{
		firstcall = false;
		prevrtcptime = RTPTime::CurrentTime();
		pmembers = sources.GetActiveMemberCount();
		CalculateNextRTCPTime();
	}
	
	RTPTime curtime = RTPTime::CurrentTime();

	if (curtime > nextrtcptime) // packet should be sent
		return RTPTime(0,0);

	RTPTime diff = nextrtcptime;
	diff -= curtime;
	
	return diff;
}